

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * __thiscall Kvm::makeSymbol(Kvm *this,string *str)

{
  pointer pcVar1;
  iterator iVar2;
  Value *v;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>,_bool>
  pVar3;
  long *local_50 [2];
  long local_40 [2];
  Value *local_30;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symbols)._M_h,str);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    v = Kgc::allocValue(&this->gc_,SYMBOL);
    pcVar1 = (str->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + str->_M_string_length);
    local_30 = v;
    pVar3 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Value_const*>,std::allocator<std::pair<std::__cxx11::string_const,Value_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,Value_const*>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Value_const*>,std::allocator<std::pair<std::__cxx11::string_const,Value_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->symbols,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    v[1]._vptr_Value =
         *(_func_int ***)
          ((long)pVar3.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
          + 8);
    Kgc::pushStackRoot(&this->gc_,v);
  }
  else {
    v = *(Value **)
         ((long)iVar2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
                ._M_cur + 0x28);
  }
  return v;
}

Assistant:

const Value*Kvm::makeSymbol(const std::string &str)
{
    auto iter = symbols.find(str);
    if (iter != symbols.end())
    {
        return iter->second;
    } else
    {
        Symbol *s = static_cast<Symbol *>(gc_.allocValue(ValueType::SYMBOL));
        auto r = symbols.insert({str, s});
        s->value_ = r.first->first.c_str();
        gc_.pushStackRoot(s);
        return s;
    }
}